

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t set_mode(archive_write_disk *a,wchar_t mode)

{
  wchar_t wVar1;
  int iVar2;
  int *piVar3;
  int local_24;
  wchar_t local_20;
  wchar_t r2;
  wchar_t r;
  wchar_t mode_local;
  archive_write_disk *a_local;
  
  local_20 = L'\0';
  r2 = mode & 0xfff;
  if ((a->todo & 0x2000000U) == 0) {
    if ((a->todo & 0x8000000U) != 0) {
      if ((a->user_uid != a->uid) && (r2 = mode & 0x7ff, (a->flags & 1U) != 0)) {
        archive_set_error(&a->archive,-1,"Can\'t make file SUID");
        local_20 = L'\xffffffec';
      }
      a->todo = a->todo & 0xf7ffffff;
    }
  }
  else {
    wVar1 = lazy_stat(a);
    if (wVar1 != L'\0') {
      return wVar1;
    }
    local_20 = L'\0';
    if (((ulong)a->pst->st_gid != a->gid) && (r2 = mode & 0xbff, (a->flags & 1U) != 0)) {
      archive_set_error(&a->archive,-1,"Can\'t restore SGID bit");
      local_20 = L'\xffffffec';
    }
    if ((((ulong)a->pst->st_uid != a->uid) && ((a->todo & 0x10000000U) != 0)) &&
       (r2 = r2 & 0xfffff7ff, (a->flags & 1U) != 0)) {
      archive_set_error(&a->archive,-1,"Can\'t restore SUID bit");
      local_20 = L'\xffffffec';
    }
    a->todo = a->todo & 0xfdffffff;
    a->todo = a->todo & 0xf7ffffff;
  }
  if ((a->mode & 0xf000) == 0xa000) {
    iVar2 = lchmod(a->name,r2);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      if ((*piVar3 != 0x26) && (*piVar3 != 0x5f)) {
        piVar3 = __errno_location();
        archive_set_error(&a->archive,*piVar3,"Can\'t set permissions to 0%o",(ulong)(uint)r2);
        local_20 = L'\xffffffec';
      }
    }
  }
  else if ((a->mode & 0xf000) != 0x4000) {
    if (a->fd < L'\0') {
      local_24 = chmod(a->name,r2);
    }
    else {
      local_24 = fchmod(a->fd,r2);
    }
    if (local_24 != 0) {
      piVar3 = __errno_location();
      archive_set_error(&a->archive,*piVar3,"Can\'t set permissions to 0%o",(ulong)(uint)r2);
      local_20 = L'\xffffffec';
    }
  }
  return local_20;
}

Assistant:

static int
set_mode(struct archive_write_disk *a, int mode)
{
	int r = ARCHIVE_OK;
	int r2;
	mode &= 07777; /* Strip off file type bits. */

	if (a->todo & TODO_SGID_CHECK) {
		/*
		 * If we don't know the GID is right, we must stat()
		 * to verify it.  We can't just check the GID of this
		 * process, since systems sometimes set GID from
		 * the enclosing dir or based on ACLs.
		 */
		if ((r = lazy_stat(a)) != ARCHIVE_OK)
			return (r);
		if (a->pst->st_gid != a->gid) {
			mode &= ~ S_ISGID;
			if (a->flags & ARCHIVE_EXTRACT_OWNER) {
				/*
				 * This is only an error if you
				 * requested owner restore.  If you
				 * didn't, we'll try to restore
				 * sgid/suid, but won't consider it a
				 * problem if we can't.
				 */
				archive_set_error(&a->archive, -1,
				    "Can't restore SGID bit");
				r = ARCHIVE_WARN;
			}
		}
		/* While we're here, double-check the UID. */
		if (a->pst->st_uid != a->uid
		    && (a->todo & TODO_SUID)) {
			mode &= ~ S_ISUID;
			if (a->flags & ARCHIVE_EXTRACT_OWNER) {
				archive_set_error(&a->archive, -1,
				    "Can't restore SUID bit");
				r = ARCHIVE_WARN;
			}
		}
		a->todo &= ~TODO_SGID_CHECK;
		a->todo &= ~TODO_SUID_CHECK;
	} else if (a->todo & TODO_SUID_CHECK) {
		/*
		 * If we don't know the UID is right, we can just check
		 * the user, since all systems set the file UID from
		 * the process UID.
		 */
		if (a->user_uid != a->uid) {
			mode &= ~ S_ISUID;
			if (a->flags & ARCHIVE_EXTRACT_OWNER) {
				archive_set_error(&a->archive, -1,
				    "Can't make file SUID");
				r = ARCHIVE_WARN;
			}
		}
		a->todo &= ~TODO_SUID_CHECK;
	}

	if (S_ISLNK(a->mode)) {
#ifdef HAVE_LCHMOD
		/*
		 * If this is a symlink, use lchmod().  If the
		 * platform doesn't support lchmod(), just skip it.  A
		 * platform that doesn't provide a way to set
		 * permissions on symlinks probably ignores
		 * permissions on symlinks, so a failure here has no
		 * impact.
		 */
		if (lchmod(a->name, mode) != 0) {
			switch (errno) {
			case ENOTSUP:
			case ENOSYS:
#if ENOTSUP != EOPNOTSUPP
			case EOPNOTSUPP:
#endif
				/*
				 * if lchmod is defined but the platform
				 * doesn't support it, silently ignore
				 * error
				 */
				break;
			default:
				archive_set_error(&a->archive, errno,
				    "Can't set permissions to 0%o", (int)mode);
				r = ARCHIVE_WARN;
			}
		}
#endif
	} else if (!S_ISDIR(a->mode)) {
		/*
		 * If it's not a symlink and not a dir, then use
		 * fchmod() or chmod(), depending on whether we have
		 * an fd.  Dirs get their perms set during the
		 * post-extract fixup, which is handled elsewhere.
		 */
#ifdef HAVE_FCHMOD
		if (a->fd >= 0)
			r2 = fchmod(a->fd, mode);
		else
#endif
		/* If this platform lacks fchmod(), then
		 * we'll just use chmod(). */
		r2 = chmod(a->name, mode);

		if (r2 != 0) {
			archive_set_error(&a->archive, errno,
			    "Can't set permissions to 0%o", (int)mode);
			r = ARCHIVE_WARN;
		}
	}
	return (r);
}